

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O0

void nn_cws_destroy(void *self)

{
  nn_chunkref *in_RDI;
  nn_cws *cws;
  
  nn_chunkref_term(in_RDI);
  nn_chunkref_term(in_RDI);
  nn_chunkref_term(in_RDI);
  nn_dns_term((nn_dns *)0x1448a7);
  nn_sws_term((nn_sws *)0x1448b8);
  nn_backoff_term((nn_backoff *)0x1448c9);
  nn_usock_term((nn_usock *)0x1448d7);
  nn_fsm_term((nn_fsm *)0x1448e1);
  nn_free((void *)0x1448eb);
  return;
}

Assistant:

static void nn_cws_destroy (void *self)
{
    struct nn_cws *cws = self;

    nn_chunkref_term (&cws->resource);
    nn_chunkref_term (&cws->remote_host);
    nn_chunkref_term (&cws->nic);
    nn_dns_term (&cws->dns);
    nn_sws_term (&cws->sws);
    nn_backoff_term (&cws->retry);
    nn_usock_term (&cws->usock);
    nn_fsm_term (&cws->fsm);

    nn_free (cws);
}